

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Callbacks.cpp
# Opt level: O2

void celero::impl::ExperimentResultComplete(shared_ptr<celero::ExperimentResult> *x)

{
  pointer pfVar1;
  pointer this;
  __shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  pfVar1 = ExperimentResultFunctions.
           super__Vector_base<std::function<void_(std::shared_ptr<celero::ExperimentResult>)>,_std::allocator<std::function<void_(std::shared_ptr<celero::ExperimentResult>)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this = ExperimentResultFunctions.
              super__Vector_base<std::function<void_(std::shared_ptr<celero::ExperimentResult>)>,_std::allocator<std::function<void_(std::shared_ptr<celero::ExperimentResult>)>_>_>
              ._M_impl.super__Vector_impl_data._M_start; this != pfVar1; this = this + 1) {
    std::__shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_38,
               &x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>);
    std::function<void_(std::shared_ptr<celero::ExperimentResult>)>::operator()
              (this,(shared_ptr<celero::ExperimentResult> *)&_Stack_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  }
  return;
}

Assistant:

void celero::impl::ExperimentResultComplete(std::shared_ptr<celero::ExperimentResult> x)
{
	for(auto& i : ExperimentResultFunctions)
	{
		i(x);
	}
}